

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall QComboBoxPrivate::setCurrentIndex(QComboBoxPrivate *this,QModelIndex *mi)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  SelectionBehavior SVar4;
  QComboBoxPrivate *this_00;
  QCompleter *pQVar5;
  QItemSelectionModel *pQVar6;
  QModelIndex *in_RSI;
  QComboBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  QItemSelectionModel *model;
  bool modelResetToEmpty;
  bool indexChanged;
  QComboBox *q;
  SelectionFlags selectionMode;
  QString newText;
  QModelIndex normalized;
  undefined4 in_stack_ffffffffffffff18;
  SelectionFlag in_stack_ffffffffffffff1c;
  QModelIndex *in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff28;
  undefined2 in_stack_ffffffffffffff2c;
  undefined1 in_stack_ffffffffffffff2e;
  undefined1 uVar7;
  undefined1 in_stack_ffffffffffffff2f;
  QModelIndex *this_01;
  QCompleter *in_stack_ffffffffffffff40;
  undefined6 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4e;
  QPersistentModelIndex local_98 [3];
  undefined4 local_7c;
  QPersistentModelIndex local_78 [3];
  undefined4 local_5c;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  QPersistentModelIndex local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  QAbstractItemModel *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QComboBoxPrivate *)q_func(in_RDI);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  this_01 = in_RSI;
  QModelIndex::row(in_RSI);
  QModelIndex::sibling
            (this_01,CONCAT13(in_stack_ffffffffffffff2f,
                              CONCAT12(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff2c)),
             in_stack_ffffffffffffff28);
  bVar1 = QModelIndex::isValid(in_stack_ffffffffffffff20);
  if (!bVar1) {
    local_20 = *(undefined1 **)in_RSI;
    local_18 = (undefined1 *)in_RSI->i;
    local_10 = (in_RSI->m).ptr;
  }
  bVar2 = ::operator!=(in_stack_ffffffffffffff20,
                       (QPersistentModelIndex *)
                       CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  if ((bool)bVar2) {
    QPersistentModelIndex::QPersistentModelIndex(&local_28,(QModelIndex *)&local_20);
    QPersistentModelIndex::operator=
              ((QPersistentModelIndex *)in_stack_ffffffffffffff20,
               (QPersistentModelIndex *)
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    QPersistentModelIndex::~QPersistentModelIndex(&local_28);
  }
  if (in_RDI->lineEdit != (QLineEdit *)0x0) {
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    itemText(this_00,(QModelIndex *)
                     CONCAT17(bVar2,CONCAT16(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48)));
    QLineEdit::text((QLineEdit *)
                    CONCAT17(in_stack_ffffffffffffff2f,
                             CONCAT16(in_stack_ffffffffffffff2e,
                                      CONCAT24(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28))
                            ));
    bVar3 = ::operator!=((QString *)in_stack_ffffffffffffff20,
                         (QString *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    QString::~QString((QString *)0x53141d);
    if ((((bVar3 & 1) != 0) &&
        (QLineEdit::setText((QLineEdit *)in_stack_ffffffffffffff20,
                            (QString *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
                           ), in_RDI->lineEdit != (QLineEdit *)0x0)) &&
       (pQVar5 = QLineEdit::completer((QLineEdit *)in_stack_ffffffffffffff20),
       pQVar5 != (QCompleter *)0x0)) {
      QLineEdit::completer((QLineEdit *)in_stack_ffffffffffffff20);
      QCompleter::setCompletionPrefix(in_stack_ffffffffffffff40,(QString *)in_RDI);
    }
    updateLineEditGeometry
              ((QComboBoxPrivate *)
               CONCAT17(bVar2,CONCAT16(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48)));
    QString::~QString((QString *)0x5314a0);
  }
  bVar1 = QModelIndex::isValid(in_stack_ffffffffffffff20);
  uVar7 = false;
  if (!bVar1) {
    uVar7 = in_RDI->indexBeforeChange != -1;
  }
  if ((bool)uVar7 != false) {
    in_RDI->indexBeforeChange = -1;
  }
  if (((bVar2 & 1) != 0) || ((bool)uVar7 != false)) {
    local_5c = 0xaaaaaaaa;
    QFlags<QItemSelectionModel::SelectionFlag>::QFlags
              ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_ffffffffffffff20,
               in_stack_ffffffffffffff1c);
    QComboBox::view((QComboBox *)in_stack_ffffffffffffff20);
    SVar4 = QAbstractItemView::selectionBehavior((QAbstractItemView *)in_stack_ffffffffffffff20);
    if (SVar4 == SelectRows) {
      QFlags<QItemSelectionModel::SelectionFlag>::setFlag
                ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_ffffffffffffff40,
                 (SelectionFlag)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
    }
    QComboBox::view((QComboBox *)in_stack_ffffffffffffff20);
    pQVar6 = QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_ffffffffffffff20);
    if (pQVar6 != (QItemSelectionModel *)0x0) {
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_78);
      local_7c = local_5c;
      (**(code **)(*(long *)pQVar6 + 0x60))(pQVar6,local_78,local_5c);
    }
    QWidget::update((QWidget *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_98);
    emitCurrentIndexChanged
              (this_00,(QModelIndex *)CONCAT17(bVar2,CONCAT16(uVar7,in_stack_ffffffffffffff48)));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QComboBoxPrivate::setCurrentIndex(const QModelIndex &mi)
{
    Q_Q(QComboBox);

    QModelIndex normalized = mi.sibling(mi.row(), modelColumn); // no-op if mi.column() == modelColumn
    if (!normalized.isValid())
        normalized = mi;    // Fallback to passed index.

    bool indexChanged = (normalized != currentIndex);
    if (indexChanged)
        currentIndex = QPersistentModelIndex(normalized);
    if (lineEdit) {
        const QString newText = itemText(normalized);
        if (lineEdit->text() != newText) {
            lineEdit->setText(newText); // may cause lineEdit -> nullptr (QTBUG-54191)
#if QT_CONFIG(completer)
            if (lineEdit && lineEdit->completer())
                lineEdit->completer()->setCompletionPrefix(newText);
#endif
        }
        updateLineEditGeometry();
    }
    // If the model was reset to an empty one, currentIndex will be invalidated
    // (because it's a QPersistentModelIndex), but the index change will never
    // be advertised. So an explicit check for this condition is needed.
    // The variable used for that check has to be reset when a previously valid
    // index becomes invalid.
    const bool modelResetToEmpty = !normalized.isValid() && indexBeforeChange != -1;
    if (modelResetToEmpty)
        indexBeforeChange = -1;

    if (indexChanged || modelResetToEmpty) {
        QItemSelectionModel::SelectionFlags selectionMode = QItemSelectionModel::ClearAndSelect;
        if (q->view()->selectionBehavior() == QAbstractItemView::SelectRows)
            selectionMode.setFlag(QItemSelectionModel::Rows);
        if (auto *model = q->view()->selectionModel())
            model->setCurrentIndex(currentIndex, selectionMode);

        q->update();
        emitCurrentIndexChanged(currentIndex);
    }
}